

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# App.hpp
# Opt level: O2

App * __thiscall CLI::App::add_subcommand(App *this,string *name,string *description)

{
  pointer puVar1;
  App *pAVar2;
  bool bVar3;
  App *pAVar4;
  OptionAlreadyAdded *this_00;
  pointer puVar5;
  string sStack_b8;
  string local_98;
  App *local_78;
  string local_70;
  string local_50;
  
  pAVar4 = (App *)operator_new(0x1d0);
  ::std::__cxx11::string::string((string *)&local_98,(string *)description);
  App(pAVar4,&local_98,this);
  local_78 = pAVar4;
  ::std::
  vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>
  ::emplace_back<CLI::App*>
            ((vector<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>,std::allocator<std::unique_ptr<CLI::App,std::default_delete<CLI::App>>>>
              *)&this->subcommands_,&local_78);
  ::std::__cxx11::string::~string((string *)&local_98);
  ::std::__cxx11::string::_M_assign
            ((string *)
             &((this->subcommands_).
               super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->name_);
  puVar5 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->subcommands_).
           super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (puVar5 == puVar1) {
      return (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    }
    pAVar4 = (puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    pAVar2 = (this->subcommands_).
             super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
             super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
             super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
             super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
    if (pAVar4 != pAVar2) {
      ::std::__cxx11::string::string((string *)&sStack_b8,(string *)&pAVar2->name_);
      bVar3 = check_name(pAVar4,&sStack_b8);
      if (bVar3) {
        ::std::__cxx11::string::~string((string *)&sStack_b8);
LAB_00116fa0:
        this_00 = (OptionAlreadyAdded *)__cxa_allocate_exception(0x38);
        ::std::__cxx11::string::string
                  ((string *)&local_70,
                   (string *)
                   &((puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                     _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                     super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->name_);
        OptionAlreadyAdded::OptionAlreadyAdded(this_00,&local_70);
        __cxa_throw(this_00,&OptionAlreadyAdded::typeinfo,Error::~Error);
      }
      pAVar4 = (this->subcommands_).
               super__Vector_base<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>,_std::allocator<std::unique_ptr<CLI::App,_std::default_delete<CLI::App>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish[-1]._M_t.
               super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>._M_t.
               super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
               super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl;
      ::std::__cxx11::string::string
                ((string *)&local_50,
                 (string *)
                 &((puVar5->_M_t).super___uniq_ptr_impl<CLI::App,_std::default_delete<CLI::App>_>.
                   _M_t.super__Tuple_impl<0UL,_CLI::App_*,_std::default_delete<CLI::App>_>.
                   super__Head_base<0UL,_CLI::App_*,_false>._M_head_impl)->name_);
      bVar3 = check_name(pAVar4,&local_50);
      ::std::__cxx11::string::~string((string *)&local_50);
      ::std::__cxx11::string::~string((string *)&sStack_b8);
      if (bVar3) goto LAB_00116fa0;
    }
    puVar5 = puVar5 + 1;
  } while( true );
}

Assistant:

App *add_subcommand(std::string name, std::string description = "") {
        subcommands_.emplace_back(new App(description, this));
        subcommands_.back()->name_ = name;
        for(const auto &subc : subcommands_)
            if(subc.get() != subcommands_.back().get())
                if(subc->check_name(subcommands_.back()->name_) || subcommands_.back()->check_name(subc->name_))
                    throw OptionAlreadyAdded(subc->name_);
        return subcommands_.back().get();
    }